

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relax_float_ops_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::RelaxFloatOpsPass::IsRelaxable(RelaxFloatOpsPass *this,Instruction *inst)

{
  Op OVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  size_type sVar4;
  IRContext *this_00;
  FeatureManager *this_01;
  size_type sVar5;
  bool local_51;
  bool local_29;
  uint32_t local_28;
  Op local_24;
  Op local_20;
  Op local_1c;
  Instruction *local_18;
  Instruction *inst_local;
  RelaxFloatOpsPass *this_local;
  
  local_18 = inst;
  inst_local = (Instruction *)this;
  local_1c = opt::Instruction::opcode(inst);
  sVar4 = std::
          unordered_set<spv::Op,_spvtools::opt::RelaxFloatOpsPass::hasher,_std::equal_to<spv::Op>,_std::allocator<spv::Op>_>
          ::count(&this->target_ops_core_f_rslt_,&local_1c);
  local_29 = true;
  if (sVar4 == 0) {
    local_20 = opt::Instruction::opcode(local_18);
    sVar4 = std::
            unordered_set<spv::Op,_spvtools::opt::RelaxFloatOpsPass::hasher,_std::equal_to<spv::Op>,_std::allocator<spv::Op>_>
            ::count(&this->target_ops_core_f_opnd_,&local_20);
    local_29 = true;
    if (sVar4 == 0) {
      local_24 = opt::Instruction::opcode(local_18);
      sVar4 = std::
              unordered_set<spv::Op,_spvtools::opt::RelaxFloatOpsPass::hasher,_std::equal_to<spv::Op>,_std::allocator<spv::Op>_>
              ::count(&this->sample_ops_,&local_24);
      local_29 = true;
      if (sVar4 == 0) {
        OVar1 = opt::Instruction::opcode(local_18);
        local_51 = false;
        if (OVar1 == OpExtInst) {
          uVar2 = opt::Instruction::GetSingleWordInOperand(local_18,0);
          this_00 = Pass::context(&this->super_Pass);
          this_01 = IRContext::get_feature_mgr(this_00);
          uVar3 = FeatureManager::GetExtInstImportId_GLSLstd450(this_01);
          local_51 = false;
          if (uVar2 == uVar3) {
            local_28 = opt::Instruction::GetSingleWordInOperand(local_18,1);
            sVar5 = std::
                    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    ::count(&this->target_ops_450_,&local_28);
            local_51 = sVar5 != 0;
          }
        }
        local_29 = local_51;
      }
    }
  }
  return local_29;
}

Assistant:

bool RelaxFloatOpsPass::IsRelaxable(Instruction* inst) {
  return target_ops_core_f_rslt_.count(inst->opcode()) != 0 ||
         target_ops_core_f_opnd_.count(inst->opcode()) != 0 ||
         sample_ops_.count(inst->opcode()) != 0 ||
         (inst->opcode() == spv::Op::OpExtInst &&
          inst->GetSingleWordInOperand(0) ==
              context()->get_feature_mgr()->GetExtInstImportId_GLSLstd450() &&
          target_ops_450_.count(inst->GetSingleWordInOperand(1)) != 0);
}